

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrasalrule.h
# Opt level: O2

int __thiscall jhu::thrax::PhrasalRule::ntIndex(PhrasalRule *this,NT *needle)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  Rhs *__range2;
  
  iVar3 = 1;
  lVar4 = 0;
  while ((iVar2 = 0, lVar4 != 0x60 &&
         (bVar1 = SpanPair::operator==
                            ((SpanPair *)((long)&(this->nts)._M_elems[0].span.src.start + lVar4),
                             needle->span), iVar2 = iVar3, !bVar1))) {
    iVar3 = iVar3 + 1;
    lVar4 = lVar4 + 0x18;
  }
  return iVar2;
}

Assistant:

int ntIndex(const NT& needle) const {
    int i = 1;
    for (const auto& nt : nts) {
      if (nt.span == needle.span) {
        return i;
      } else {
        i++;
      }
    }
    return 0;
  }